

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

void uv__inotify_read(uv_loop_t *loop,uv__io_t *dummy,uint events)

{
  uv__queue *puVar1;
  uint uVar2;
  uv__queue *puVar3;
  ssize_t sVar4;
  char *pcVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  watcher_list *w;
  uv__queue queue;
  char buf [4096];
  uv__queue local_1058;
  uv_loop_t *local_1048;
  int *local_1040;
  int local_1038 [1026];
  
  local_1048 = loop;
  do {
    while (sVar4 = read(loop->inotify_fd,local_1038,0x1000), sVar4 == -1) {
      piVar6 = __errno_location();
      if (*piVar6 != 4) {
        if (*piVar6 != 0xb) {
          __assert_fail("errno == EAGAIN || errno == EWOULDBLOCK",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                        ,0x9a1,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
        }
        return;
      }
    }
    if (sVar4 < 1) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                    ,0x9a5,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    piVar7 = (int *)((long)local_1038 + sVar4);
    piVar6 = local_1038;
    local_1040 = piVar7;
    do {
      uVar2 = piVar6[1];
      w = (watcher_list *)loop->inotify_watchers;
      if (w != (watcher_list *)0x0) {
LAB_0011e4a9:
        if (*piVar6 < w->wd) goto LAB_0011e4b5;
        if (w->wd < *piVar6) {
          w = (watcher_list *)&(w->entry).rbe_right;
          goto LAB_0011e4b5;
        }
        if (piVar6[3] == 0) {
          piVar7 = (int *)w->path;
          pcVar5 = strrchr((char *)piVar7,0x2f);
          piVar8 = (int *)(pcVar5 + 1);
          if (pcVar5 == (char *)0x0) {
            piVar8 = piVar7;
          }
        }
        else {
          piVar8 = piVar6 + 4;
        }
        w->iterating = 1;
        puVar1 = &w->watchers;
        local_1058.next = (w->watchers).next;
        puVar3 = &local_1058;
        local_1058.prev = &local_1058;
        if (local_1058.next != puVar1) {
          local_1058.prev = (w->watchers).prev;
          (local_1058.prev)->next = &local_1058;
          puVar3 = (local_1058.next)->prev;
          (w->watchers).prev = puVar3;
          puVar3->next = puVar1;
          (local_1058.next)->prev = &local_1058;
          while (puVar3 = local_1058.next, local_1058.next != &local_1058) {
            puVar3 = (local_1058.next)->next;
            (local_1058.next)->prev->next = puVar3;
            puVar3->prev = (local_1058.next)->prev;
            (local_1058.next)->next = puVar1;
            puVar3 = (w->watchers).prev;
            (local_1058.next)->prev = puVar3;
            puVar3->next = local_1058.next;
            (w->watchers).prev = local_1058.next;
            (*(code *)local_1058.next[-1].prev)
                      (local_1058.next + -5,piVar8,
                       ((uVar2 & 0xfffffff9) != 0) + ((uVar2 & 6) != 0) * '\x02',0);
          }
        }
        local_1058.next = puVar3;
        loop = local_1048;
        w->iterating = 0;
        maybe_free_watcher_list(w,local_1048);
        piVar7 = local_1040;
      }
LAB_0011e585:
      piVar6 = (int *)((long)piVar6 + (ulong)(uint)piVar6[3] + 0x10);
    } while (piVar6 < piVar7);
  } while( true );
LAB_0011e4b5:
  w = (w->entry).rbe_left;
  if (w == (watcher_list *)0x0) goto LAB_0011e585;
  goto LAB_0011e4a9;
}

Assistant:

static void uv__inotify_read(uv_loop_t* loop,
                             uv__io_t* dummy,
                             unsigned int events) {
  const struct inotify_event* e;
  struct watcher_list* w;
  uv_fs_event_t* h;
  struct uv__queue queue;
  struct uv__queue* q;
  const char* path;
  ssize_t size;
  const char *p;
  /* needs to be large enough for sizeof(inotify_event) + strlen(path) */
  char buf[4096];

  for (;;) {
    do
      size = read(loop->inotify_fd, buf, sizeof(buf));
    while (size == -1 && errno == EINTR);

    if (size == -1) {
      assert(errno == EAGAIN || errno == EWOULDBLOCK);
      break;
    }

    assert(size > 0); /* pre-2.6.21 thing, size=0 == read buffer too small */

    /* Now we have one or more inotify_event structs. */
    for (p = buf; p < buf + size; p += sizeof(*e) + e->len) {
      e = (const struct inotify_event*) p;

      events = 0;
      if (e->mask & (IN_ATTRIB|IN_MODIFY))
        events |= UV_CHANGE;
      if (e->mask & ~(IN_ATTRIB|IN_MODIFY))
        events |= UV_RENAME;

      w = find_watcher(loop, e->wd);
      if (w == NULL)
        continue; /* Stale event, no watchers left. */

      /* inotify does not return the filename when monitoring a single file
       * for modifications. Repurpose the filename for API compatibility.
       * I'm not convinced this is a good thing, maybe it should go.
       */
      path = e->len ? (const char*) (e + 1) : uv__basename_r(w->path);

      /* We're about to iterate over the queue and call user's callbacks.
       * What can go wrong?
       * A callback could call uv_fs_event_stop()
       * and the queue can change under our feet.
       * So, we use uv__queue_move() trick to safely iterate over the queue.
       * And we don't free the watcher_list until we're done iterating.
       *
       * First,
       * tell uv_fs_event_stop() (that could be called from a user's callback)
       * not to free watcher_list.
       */
      w->iterating = 1;
      uv__queue_move(&w->watchers, &queue);
      while (!uv__queue_empty(&queue)) {
        q = uv__queue_head(&queue);
        h = uv__queue_data(q, uv_fs_event_t, watchers);

        uv__queue_remove(q);
        uv__queue_insert_tail(&w->watchers, q);

        h->cb(h, path, events, 0);
      }
      /* done iterating, time to (maybe) free empty watcher_list */
      w->iterating = 0;
      maybe_free_watcher_list(w, loop);
    }
  }
}